

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifgtw_cb(void *ctx0,vocdef *voc,vocwdef *vocw)

{
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  bifgtw_cb_ctx *ctx;
  
  if (((*(byte *)(in_RDX + 7) & 8) == 0) && ((uint)*(byte *)(in_RDX + 6) == *(uint *)(in_RDI + 1)))
  {
    *(undefined1 *)*in_RDI = 3;
    memcpy((void *)(*in_RDI + 3),(void *)(in_RSI + 0x10),(ulong)*(byte *)(in_RSI + 8));
    if (*(char *)(in_RSI + 9) == '\0') {
      oswp2((void *)(*in_RDI + 1),*(byte *)(in_RSI + 8) + 2);
      *in_RDI = *in_RDI + (long)(int)(*(byte *)(in_RSI + 8) + 3);
    }
    else {
      *(undefined1 *)(*in_RDI + 3 + (long)(int)(uint)*(byte *)(in_RSI + 8)) = 0x20;
      memcpy((void *)(*in_RDI + 4 + (long)(int)(uint)*(byte *)(in_RSI + 8)),
             (void *)(in_RSI + 0x10 + (long)(int)(uint)*(byte *)(in_RSI + 8)),
             (ulong)*(byte *)(in_RSI + 9));
      oswp2((void *)(*in_RDI + 1),(uint)*(byte *)(in_RSI + 8) + (uint)*(byte *)(in_RSI + 9) + 3);
      *in_RDI = *in_RDI + (long)(int)((uint)*(byte *)(in_RSI + 8) + (uint)*(byte *)(in_RSI + 9) + 4)
      ;
    }
  }
  return;
}

Assistant:

static void bifgtw_cb(void *ctx0, vocdef *voc, vocwdef *vocw)
{
    struct bifgtw_cb_ctx *ctx = (struct bifgtw_cb_ctx *)ctx0;

    /* ignore deleted objects */
    if (vocw->vocwflg & VOCFDEL)
        return;

    /* ignore objects of the inappropriate type */
    if (vocw->vocwtyp != ctx->typ)
        return;
    
    /* the datatype is string */
    *ctx->p = DAT_SSTRING;

    /* copy the first word */
    memcpy(ctx->p + 3, voc->voctxt, (size_t)voc->voclen);

    /* if there are two words, add a space and the second word */
    if (voc->vocln2)
    {
        *(ctx->p + 3 + voc->voclen) = ' ';
        memcpy(ctx->p + 4 + voc->voclen, voc->voctxt + voc->voclen,
               (size_t)voc->vocln2);
        oswp2(ctx->p + 1, voc->voclen + voc->vocln2 + 3);
        ctx->p += voc->voclen + voc->vocln2 + 4;
    }
    else
    {
        oswp2(ctx->p + 1, voc->voclen+2);
        ctx->p += voc->voclen + 3;
    }
}